

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

void __thiscall rtosc::RtData::reply(RtData *this,char *path,char *args,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  char buffer [8192];
  __va_list_tag local_20e8;
  undefined1 local_20c8 [24];
  undefined8 local_20b0;
  undefined8 local_20a8;
  undefined8 local_20a0;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  undefined8 local_2038;
  undefined8 local_2028;
  char local_2018 [8200];
  
  local_20e8.reg_save_area = local_20c8;
  if (in_AL != '\0') {
    local_2098 = in_XMM0_Qa;
    local_2088 = in_XMM1_Qa;
    local_2078 = in_XMM2_Qa;
    local_2068 = in_XMM3_Qa;
    local_2058 = in_XMM4_Qa;
    local_2048 = in_XMM5_Qa;
    local_2038 = in_XMM6_Qa;
    local_2028 = in_XMM7_Qa;
  }
  local_20e8.overflow_arg_area = &va[0].overflow_arg_area;
  local_20e8.gp_offset = 0x18;
  local_20e8.fp_offset = 0x30;
  local_20b0 = in_RCX;
  local_20a8 = in_R8;
  local_20a0 = in_R9;
  rtosc_vmessage(local_2018,0x2000,path,args,&local_20e8);
  (*this->_vptr_RtData[4])(this,local_2018);
  return;
}

Assistant:

void RtData::reply(const char *path, const char *args, ...)
{
    va_list va;
    va_start(va,args);
    char buffer[8192];
    rtosc_vmessage(buffer,8192,path,args,va);
    reply(buffer);
    va_end(va);
}